

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommentReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::CommentReliablePdu::marshal(CommentReliablePdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  undefined1 local_78 [8];
  VariableDatum x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  FixedDatum x;
  size_t idx;
  DataStream *dataStream_local;
  CommentReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::marshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  sVar2 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                    (&this->_fixedDatumRecords);
  DataStream::operator<<(dataStream,(uint)sVar2);
  sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                    (&this->_variableDatumRecords);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x._fixedDatumID = 0;
  x._fixedDatumValue = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatumRecords);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&this->_fixedDatumRecords,x._8_8_);
    FixedDatum::FixedDatum((FixedDatum *)local_30,pvVar3);
    FixedDatum::marshal((FixedDatum *)local_30,dataStream);
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._arrayLength = 0;
  x_1._44_4_ = 0;
  while( true ) {
    uVar1 = x_1._40_8_;
    sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatumRecords);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatumRecords,x_1._40_8_);
    VariableDatum::VariableDatum((VariableDatum *)local_78,pvVar4);
    VariableDatum::marshal((VariableDatum *)local_78,dataStream);
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
    x_1._40_8_ = x_1._40_8_ + 1;
  }
  return;
}

Assistant:

void CommentReliablePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementWithReliabilityFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << ( unsigned int )_fixedDatumRecords.size();
    dataStream << ( unsigned int )_variableDatumRecords.size();

     for(size_t idx = 0; idx < _fixedDatumRecords.size(); idx++)
     {
        FixedDatum x = _fixedDatumRecords[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumRecords.size(); idx++)
     {
        VariableDatum x = _variableDatumRecords[idx];
        x.marshal(dataStream);
     }

}